

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# party.cpp
# Opt level: O3

void __thiscall Party::RefreshMembers(Party *this,Character *character,bool create)

{
  pointer ppCVar1;
  Character *this_00;
  int iVar2;
  PacketAction action;
  undefined7 in_register_00000011;
  pointer ppCVar3;
  PacketBuilder builder;
  string local_80;
  PacketBuilder local_60;
  
  action = PACKET_LIST;
  if ((int)CONCAT71(in_register_00000011,create) != 0) {
    action = PACKET_CREATE;
  }
  PacketBuilder::PacketBuilder
            (&local_60,PACKET_PARTY,action,
             ((long)(this->members).super__Vector_base<Character_*,_std::allocator<Character_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->members).super__Vector_base<Character_*,_std::allocator<Character_*>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 2) * 9);
  ppCVar3 = (this->members).super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppCVar1 = (this->members).super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppCVar3 != ppCVar1) {
    do {
      this_00 = *ppCVar3;
      iVar2 = Character::PlayerID(this_00);
      PacketBuilder::AddShort(&local_60,iVar2);
      PacketBuilder::AddChar(&local_60,(uint)(this_00 == this->leader));
      PacketBuilder::AddChar(&local_60,(uint)this_00->level);
      iVar2 = (int)(((double)this_00->hp / (double)this_00->maxhp) * 100.0);
      if (iVar2 < 1) {
        iVar2 = 0;
      }
      if (99 < iVar2) {
        iVar2 = 100;
      }
      PacketBuilder::AddChar(&local_60,iVar2);
      (*(this_00->super_Command_Source)._vptr_Command_Source[2])(&local_80,this_00);
      PacketBuilder::AddBreakString(&local_60,&local_80,0xff);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      ppCVar3 = ppCVar3 + 1;
    } while (ppCVar3 != ppCVar1);
  }
  Character::Send(character,&local_60);
  PacketBuilder::~PacketBuilder(&local_60);
  return;
}

Assistant:

void Party::RefreshMembers(Character *character, bool create)
{
	PacketBuilder builder(PACKET_PARTY, create ? PACKET_CREATE : PACKET_LIST, this->members.size() * 18);

	UTIL_FOREACH(this->members, member)
	{
		builder.AddShort(member->PlayerID());
		builder.AddChar(member == this->leader);
		builder.AddChar(member->level);
		builder.AddChar(util::clamp<int>(double(member->hp) / double(member->maxhp) * 100.0, 0, 100));
		builder.AddBreakString(member->SourceName());
	}

	character->Send(builder);
}